

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferBlockReferencedByShaderSingleBlockContentCases<(glu::Storage)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               int expandLevel)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceTestCase *pRVar5;
  deInt32 *pdVar6;
  SharedPtr dummyVariable;
  SharedPtr block;
  SharedPtr dummyVariable_1;
  SharedPtr local_90;
  Node *local_80;
  SharedPtrStateBase *local_78;
  SharedPtr local_70;
  Node *local_60;
  SharedPtrStateBase *local_58;
  TestNode *local_50;
  Node *local_48;
  SharedPtrStateBase *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  local_50 = &targetGroup->super_TestNode;
  pNVar1 = (Node *)operator_new(0x20);
  pNVar3 = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b330;
  local_48 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_40 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_60 = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_58 = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar1[1]._vptr_Node = 1;
  local_80 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0x25;
  local_90.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_90.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_70,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400
            );
  ResourceTestCase::ResourceTestCase
            (pRVar5,context,&local_90,(ProgramResourceQueryTestTarget *)&local_70,"named_block");
  tcu::TestNode::addChild(local_50,(TestNode *)pRVar5);
  pSVar2 = local_90.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_90.m_ptr = (Node *)0x0;
    (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])(local_90.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_90.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_90.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_78;
  if (local_78 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_78->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_80 = (Node *)0x0;
      (*local_78->_vptr_SharedPtrStateBase[2])(local_78);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_78 != (SharedPtrStateBase *)0x0)) {
      (*local_78->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = local_60;
  (pNVar3->m_enclosingNode).m_state = local_58;
  if (local_58 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_58->strongRefCount = local_58->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  local_78 = (SharedPtrStateBase *)0x0;
  local_80 = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78 = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0x25;
  local_90.m_state = (SharedPtrStateBase *)0x0;
  local_90.m_ptr = pNVar1;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_90.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_70,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400
            );
  ResourceTestCase::ResourceTestCase
            (pRVar5,context,&local_90,(ProgramResourceQueryTestTarget *)&local_70,"unnamed_block");
  tcu::TestNode::addChild(local_50,(TestNode *)pRVar5);
  pSVar2 = local_90.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_90.m_ptr = (Node *)0x0;
    (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])(local_90.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_90.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_90.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_78;
  if (local_78 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_78->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_80 = (Node *)0x0;
      (*local_78->_vptr_SharedPtrStateBase[2])(local_78);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_78 != (SharedPtrStateBase *)0x0)) {
      (*local_78->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = local_60;
  (pNVar3->m_enclosingNode).m_state = local_58;
  if (local_58 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_58->strongRefCount = local_58->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 3;
  local_78 = (SharedPtrStateBase *)0x0;
  local_80 = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78 = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar1->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar1[1]._vptr_Node = 1;
  local_90.m_state = (SharedPtrStateBase *)0x0;
  local_90.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_90.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar6 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar6 = *pdVar6 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0x25;
  local_70.m_state = (SharedPtrStateBase *)0x0;
  local_70.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_70.m_state = pSVar4;
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase(pRVar5,context,&local_70,&local_38,"block_array");
  tcu::TestNode::addChild(local_50,(TestNode *)pRVar5);
  pSVar2 = local_70.m_state;
  pdVar6 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_70.m_ptr = (Node *)0x0;
    (*(local_70.m_state)->_vptr_SharedPtrStateBase[2])(local_70.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_70.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_70.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar2 = local_90.m_state;
  if (local_90.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_90.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_90.m_ptr = (Node *)0x0;
      (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])(local_90.m_state);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_90.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_90.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_78;
  if (local_78 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_78->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_80 = (Node *)0x0;
      (*local_78->_vptr_SharedPtrStateBase[2])(local_78);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_78 != (SharedPtrStateBase *)0x0)) {
      (*local_78->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_58;
  if (local_58 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_58->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_60 = (Node *)0x0;
      (*local_58->_vptr_SharedPtrStateBase[2])(local_58);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_58 != (SharedPtrStateBase *)0x0)) {
      (*local_58->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar2 = local_40;
  if (local_40 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &local_40->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_48 = (Node *)0x0;
      (*local_40->_vptr_SharedPtrStateBase[2])(local_40);
    }
    LOCK();
    pdVar6 = &pSVar2->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_40 != (SharedPtrStateBase *)0x0)) {
      (*local_40->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferBlockReferencedByShaderSingleBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, int expandLevel)
{
	const ProgramInterface						programInterface	= (Storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
																      (Storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
																      (PROGRAMINTERFACE_LAST);
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	storage				(new ResourceDefinition::StorageQualifier(defaultBlock, Storage));

	DE_UNREF(expandLevel);

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "named_block"));
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "unnamed_block"));
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(storage, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "block_array"));
	}
}